

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl3cTransformFeedbackTests.cpp
# Opt level: O3

bool __thiscall
gl3cts::TransformFeedback::LinkingErrors::testNoVertexNoGeometry(LinkingErrors *this)

{
  ostringstream *poVar1;
  GLint GVar2;
  int iVar3;
  GLuint GVar4;
  undefined4 extraout_var;
  GLint linking_status;
  undefined1 local_1a0 [120];
  ios_base local_128 [264];
  
  iVar3 = (*this->m_context->m_renderCtx->_vptr_RenderContext[3])();
  linking_status = 1;
  GVar4 = Utilities::buildProgram
                    ((Functions *)CONCAT44(extraout_var,iVar3),this->m_context->m_testCtx->m_log,
                     (GLchar *)0x0,(GLchar *)0x0,(GLchar *)0x0,(GLchar *)0x0,s_fragment_shader,
                     &s_valid_transform_feedback_varying,1,0x8c8c,false,&linking_status);
  GVar2 = linking_status;
  if (linking_status == 0 && GVar4 == 0) {
    local_1a0._0_8_ = this->m_context->m_testCtx->m_log;
    poVar1 = (ostringstream *)(local_1a0 + 8);
    std::__cxx11::ostringstream::ostringstream(poVar1);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)poVar1,
               "Linking failed as expected when Transform Feedback varying was specified but program had neither vertex nor geometry shader stages."
               ,0x83);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_1a0,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream(poVar1);
    std::ios_base::~ios_base(local_128);
  }
  else {
    local_1a0._0_8_ = this->m_context->m_testCtx->m_log;
    poVar1 = (ostringstream *)(local_1a0 + 8);
    std::__cxx11::ostringstream::ostringstream(poVar1);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)poVar1,
               "Linking unexpectedly succeded when Transform Feedback varying was specified but program had neither vertex nor geometry shader stages."
               ,0x86);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_1a0,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream(poVar1);
    std::ios_base::~ios_base(local_128);
    if (GVar4 != 0) {
      (*((Functions *)CONCAT44(extraout_var,iVar3))->deleteProgram)(GVar4);
    }
  }
  return GVar2 == 0 && GVar4 == 0;
}

Assistant:

bool gl3cts::TransformFeedback::LinkingErrors::testNoVertexNoGeometry(void)
{
	/* Functions handler */
	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	/*  Check if link process fails under the following conditions:
	 <count> specified by TransformFeedbackVaryings is non-zero and program has
	 neither vertex nor geometry shader; */

	glw::GLint linking_status = 1;

	glw::GLuint program = gl3cts::TransformFeedback::Utilities::buildProgram(
		gl, m_context.getTestContext().getLog(), NULL, NULL, NULL, NULL, s_fragment_shader,
		&s_valid_transform_feedback_varying, 1, GL_INTERLEAVED_ATTRIBS, false, &linking_status);

	if ((GL_FALSE != linking_status) || program)
	{
		m_context.getTestContext().getLog() << tcu::TestLog::Message
											<< "Linking unexpectedly succeded when Transform Feedback varying was "
											   "specified but program had neither vertex nor geometry shader stages."
											<< tcu::TestLog::EndMessage;

		if (program)
		{
			gl.deleteProgram(program);
		}

		return false;
	}

	/* Log success. */
	m_context.getTestContext().getLog() << tcu::TestLog::Message
										<< "Linking failed as expected when Transform Feedback varying was specified "
										   "but program had neither vertex nor geometry shader stages."
										<< tcu::TestLog::EndMessage;

	return true;
}